

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

char * duckdb_snappy::internal::CompressFragment
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  ulong uVar4;
  short sVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  ulong uVar19;
  char *pcVar20;
  char cVar21;
  ulong *puVar22;
  ulong *puVar23;
  int *unaff_R14;
  long lVar24;
  bool bVar25;
  ulong *local_70;
  int local_64;
  ulong *local_58;
  
  puVar2 = (ulong *)(input + input_size);
  local_70 = (ulong *)op;
  puVar22 = (ulong *)input;
  if (input_size < 0xf) {
LAB_001f2752:
    if (puVar22 < puVar2) {
      iVar11 = (int)puVar2 - (int)puVar22;
      uVar13 = iVar11 - 1;
      if (iVar11 < 0x3d) {
        *(char *)local_70 = (char)uVar13 << 2;
      }
      else {
        uVar8 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = -(uint)(uVar13 == 0) | (uVar8 ^ 0x18) >> 3 ^ 3;
        *(char *)local_70 = (char)uVar8 * '\x04' + -0x10;
        *(uint *)((long)local_70 + 1) = uVar13;
        local_70 = (ulong *)((long)local_70 + (long)(int)uVar8 + 1);
      }
      switchD_00b1522a::default((void *)((long)local_70 + 1),puVar22,(long)iVar11);
      local_70 = (ulong *)((long)local_70 + (long)iVar11 + 1U);
    }
    return (char *)local_70;
  }
  uVar13 = table_size * 2 - 2;
  puVar1 = (ulong *)((long)puVar2 - 0xf);
  local_64 = *(int *)(input + 1);
LAB_001f2285:
  local_58 = (ulong *)((long)puVar22 + 1);
  uVar9 = *(ulong *)((long)puVar22 + 1);
  if ((long)puVar1 - (long)local_58 < 0x10) {
    uVar7 = 0x20;
LAB_001f23e8:
    do {
      puVar23 = (ulong *)((uVar7 >> 5) + (long)local_58);
      if (puVar1 < puVar23) {
        pcVar18 = (char *)0xd;
        local_58 = puVar22;
      }
      else {
        uVar19 = (ulong)((uint)((int)uVar9 * 0x1e35a7bd) >> 0x10 & uVar13);
        uVar3 = *(ushort *)(uVar19 + (long)table);
        unaff_R14 = (int *)(input + uVar3);
        *(short *)(uVar19 + (long)table) = (short)local_58 - (short)input;
        if (*(int *)(input + uVar3) == (int)uVar9) {
          pcVar18 = (char *)0xc;
        }
        else {
          uVar9 = (ulong)(uint)*puVar23;
          pcVar18 = (char *)0x0;
          local_58 = puVar23;
        }
      }
      uVar7 = (ulong)(uint)((int)(uVar7 >> 5) + (int)uVar7);
    } while ((int)pcVar18 == 0);
    puVar23 = local_58;
    if ((int)pcVar18 == 0xc) {
      uVar8 = (int)local_58 - (int)puVar22;
      uVar14 = uVar8 - 1;
      if ((int)uVar8 < 0x11) {
        *(char *)local_70 = (char)uVar14 << 2;
        uVar7 = puVar22[1];
        *(ulong *)((long)local_70 + 1) = *puVar22;
        *(ulong *)((long)local_70 + 9) = uVar7;
        local_70 = (ulong *)((long)local_70 + (long)(int)uVar8 + 1);
      }
      else {
        if ((int)uVar8 < 0x3d) {
          *(char *)local_70 = (char)uVar14 << 2;
          puVar23 = local_70;
        }
        else {
          uVar17 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar17 = -(uint)(uVar14 == 0) | (uVar17 ^ 0x18) >> 3 ^ 3;
          pcVar18 = (char *)(ulong)uVar17;
          *(char *)local_70 = (char)uVar17 * '\x04' + -0x10;
          *(uint *)((long)local_70 + 1) = uVar14;
          puVar23 = (ulong *)((long)local_70 + (long)(int)uVar17 + 1);
        }
        local_70 = (ulong *)((long)puVar23 + (ulong)(uVar8 & 0x7fffffff) + 1);
        puVar23 = (ulong *)((long)puVar23 + 1);
        do {
          uVar7 = puVar22[1];
          *puVar23 = *puVar22;
          puVar23[1] = uVar7;
          puVar23 = puVar23 + 2;
          puVar22 = puVar22 + 2;
        } while (puVar23 < local_70);
      }
LAB_001f2557:
      puVar22 = (ulong *)((long)local_58 + 4);
      pcVar20 = pcVar18;
      if (puVar2 + -2 < puVar22) {
        pcVar18 = (char *)0x0;
LAB_001f25a4:
        bVar25 = true;
        do {
          if (puVar2 + -2 < puVar22) {
            pcVar20 = pcVar18;
            if (puVar2 <= puVar22) goto LAB_001f2518;
            pcVar20 = (char *)((long)puVar2 + ((long)pcVar18 - (long)puVar22));
            lVar16 = (long)puVar2 - (long)puVar22;
            goto LAB_001f24f2;
          }
          uVar7 = *(ulong *)((long)unaff_R14 + (long)(pcVar18 + 4));
          uVar19 = *puVar22;
          if (uVar7 == uVar19) {
            puVar22 = puVar22 + 1;
            pcVar18 = pcVar18 + 8;
          }
          else {
            uVar12 = uVar19 ^ uVar7;
            uVar4 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            uVar9 = uVar19;
            if ((int)uVar12 == 0) {
              uVar9 = *(ulong *)((long)puVar22 + 4);
            }
            uVar9 = uVar9 >> ((byte)uVar4 & 0x18);
            pcVar20 = pcVar18 + (uVar4 >> 3 & 0x1fffffff);
            bVar25 = false;
            pcVar18 = pcVar20;
          }
        } while (uVar7 == uVar19);
      }
      else {
        uVar7 = *(ulong *)(unaff_R14 + 1);
        uVar19 = *puVar22;
        if (uVar7 == uVar19) {
          puVar22 = (ulong *)((long)local_58 + 0xc);
          pcVar18 = (char *)0x8;
        }
        else {
          uVar12 = uVar19 ^ uVar7;
          uVar4 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          uVar9 = uVar19;
          if ((int)uVar12 == 0) {
            uVar9 = local_58[1];
          }
          uVar9 = uVar9 >> ((byte)uVar4 & 0x18);
          pcVar18 = (char *)0x0;
          pcVar20 = (char *)(uVar4 >> 3 & 0x1fffffff);
        }
        bVar25 = true;
        if (uVar7 == uVar19) goto LAB_001f25a4;
      }
      goto LAB_001f260d;
    }
  }
  else {
    uVar8 = (1 - (int)input) + (int)puVar22 & 0xffff;
    lVar24 = 0;
    cVar21 = '\0';
    lVar16 = 0;
    do {
      lVar6 = 0;
      cVar10 = cVar21;
      do {
        iVar11 = (int)uVar9;
        if (lVar24 + lVar6 == 0) {
          iVar11 = local_64;
        }
        uVar7 = (ulong)((uint)(iVar11 * 0x1e35a7bd) >> 0x10 & uVar13);
        uVar3 = *(ushort *)(uVar7 + (long)table);
        *(short *)(uVar7 + (long)table) = (short)lVar6 + (short)uVar8;
        if (*(int *)(input + uVar3) == iVar11) {
          *(char *)local_70 = cVar10;
          uVar7 = puVar22[1];
          *(ulong *)((long)local_70 + 1) = *puVar22;
          *(ulong *)((long)local_70 + 9) = uVar7;
          local_58 = (ulong *)((long)local_58 + lVar6 + lVar24);
          local_70 = (ulong *)((long)local_70 + lVar6 + lVar24 + 2);
          uVar14 = 10;
          goto LAB_001f2356;
        }
        uVar9 = uVar9 >> 8;
        lVar6 = lVar6 + 1;
        cVar10 = cVar10 + '\x04';
      } while (lVar6 != 4);
      uVar14 = 7;
LAB_001f2356:
      if (uVar14 != 7) goto LAB_001f2383;
      uVar9 = *(ulong *)((long)local_58 + lVar16 * 4 + 4);
      lVar16 = lVar16 + 1;
      cVar21 = cVar21 + '\x10';
      lVar24 = lVar24 + 4;
      uVar8 = uVar8 + 4;
    } while (lVar16 != 4);
    uVar14 = 4;
LAB_001f2383:
    unaff_R14 = (int *)(input + uVar3);
    bVar25 = uVar14 == 4;
    if (bVar25) {
      uVar14 = 0;
    }
    pcVar18 = (char *)(ulong)uVar14;
    local_58 = local_58 + (ulong)bVar25 * 2;
    if (uVar14 == 10) goto LAB_001f2557;
    puVar23 = local_58;
    if (uVar14 == 0) {
      uVar7 = (ulong)((uint)bVar25 << 4 | 0x20);
      goto LAB_001f23e8;
    }
  }
  goto LAB_001f2746;
  while( true ) {
    puVar22 = (ulong *)((long)puVar22 + 1);
    pcVar18 = pcVar18 + 1;
    lVar16 = lVar16 + -1;
    if (lVar16 == 0) break;
LAB_001f24f2:
    if (*(char *)((long)unaff_R14 + (long)(pcVar18 + 4)) != (char)*puVar22) {
      pcVar20 = pcVar18;
      if (puVar22 <= puVar2 + -1) {
        uVar9 = *puVar22;
      }
      break;
    }
  }
LAB_001f2518:
  bVar25 = pcVar20 < (char *)0x8;
LAB_001f260d:
  pcVar18 = pcVar20 + 4;
  uVar7 = (long)local_58 - (long)unaff_R14;
  iVar11 = (int)uVar7;
  if (bVar25) {
    iVar15 = ((uint)(uVar7 >> 3) & 0xe0) - 0xf;
    if (0x7ff < uVar7) {
      iVar15 = -2;
    }
    iVar15 = iVar15 + iVar11 * 0x100 + (int)pcVar18 * 4;
  }
  else {
    if ((char *)0x43 < pcVar18) {
      do {
        *(uint *)local_70 = iVar11 << 8 | 0xfe;
        local_70 = (ulong *)((long)local_70 + 3);
        pcVar18 = pcVar18 + -0x40;
      } while ((char *)0x43 < pcVar18);
    }
    if ((char *)0x40 < pcVar18) {
      *(uint *)local_70 = iVar11 << 8 | 0xee;
      local_70 = (ulong *)((long)local_70 + 3);
      pcVar18 = pcVar18 + -0x3c;
    }
    uVar8 = (int)pcVar18 * 4;
    if ((char *)0xb < pcVar18) {
      *(uint *)local_70 = iVar11 * 0x100 + uVar8 + -2;
      local_70 = (ulong *)((long)local_70 + 3);
      goto LAB_001f26e0;
    }
    iVar15 = ((uint)(uVar7 >> 3) & 0xe0) - 0xf;
    if (0x7ff < uVar7) {
      iVar15 = -2;
    }
    iVar15 = iVar15 + (uVar8 | iVar11 * 0x100);
  }
  *(int *)local_70 = iVar15;
  local_70 = (ulong *)((long)local_70 + (3 - (ulong)(uVar7 < 0x800)));
LAB_001f26e0:
  puVar23 = (ulong *)((long)local_58 + (long)(pcVar20 + 4));
  pcVar18 = (char *)0xd;
  if (puVar1 <= puVar23) goto LAB_001f2746;
  sVar5 = (short)puVar23 - (short)input;
  *(short *)((ulong)((uint)(*(int *)((long)local_58 + (long)(pcVar20 + 3)) * 0x1e35a7bd) >> 0x10 &
                    uVar13) + (long)table) = sVar5 + -1;
  uVar7 = (ulong)((uint)((int)uVar9 * 0x1e35a7bd) >> 0x10 & uVar13);
  unaff_R14 = (int *)(input + *(ushort *)(uVar7 + (long)table));
  *(short *)(uVar7 + (long)table) = sVar5;
  pcVar18 = (char *)0x0;
  local_58 = puVar23;
  if (*unaff_R14 != (int)uVar9) goto code_r0x001f273b;
  goto LAB_001f2557;
code_r0x001f273b:
  pcVar18 = (char *)0x0;
  local_64 = (int)(uVar9 >> 8);
LAB_001f2746:
  puVar22 = puVar23;
  if ((int)pcVar18 != 0) goto LAB_001f2752;
  goto LAB_001f2285;
}

Assistant:

char* CompressFragment(const char* input, size_t input_size, char* op,
                       uint16_t* table, const int table_size) {
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (uint32_t preload = LittleEndian::Load32(ip + 1);;) {
      // Bytes in [next_emit, ip) will be emitted as literal bytes.  Or
      // [next_emit, ip_end) after the main loop.
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      // The body of this loop calls EmitLiteral once and then EmitCopy one or
      // more times.  (The exception is that when we're close to exhausting
      // the input we goto emit_remainder.)
      //
      // In the first iteration of this loop we're just starting, so
      // there's nothing to copy, so calling EmitLiteral once is
      // necessary.  And we only start a new iteration when the
      // current iteration has determined that a call to EmitLiteral will
      // precede the next call to EmitCopy (if any).
      //
      // Step 1: Scan forward in the input looking for a 4-byte-long match.
      // If we get close to exhausting the input then goto emit_remainder.
      //
      // Heuristic match skipping: If 32 bytes are scanned with no matches
      // found, start looking only at every other byte. If 32 more bytes are
      // scanned (or skipped), look at every third byte, etc.. When a match is
      // found, immediately go back to looking at every byte. This is a small
      // loss (~5% performance, ~0.1% density) for compressible data due to more
      // bookkeeping, but for non-compressible data (such as JPEG) it's a huge
      // win since the compressor quickly "realizes" the data is incompressible
      // and doesn't bother looking for matches everywhere.
      //
      // The "skip" variable keeps track of how many bytes there are since the
      // last match; dividing it by 32 (ie. right-shifting by five) gives the
      // number of bytes to move ahead for each iteration.
      uint32_t skip = 32;

      const char* candidate;
      if (ip_limit - ip >= 16) {
        auto delta = ip - base_ip;
        for (int j = 0; j < 4; ++j) {
          for (int k = 0; k < 4; ++k) {
            int i = 4 * j + k;
            // These for-loops are meant to be unrolled. So we can freely
            // special case the first iteration to use the value already
            // loaded in preload.
            uint32_t dword = i == 0 ? preload : static_cast<uint32_t>(data);
            assert(dword == LittleEndian::Load32(ip + i));
            uint16_t* table_entry = TableEntry(table, dword, mask);
            candidate = base_ip + *table_entry;
            assert(candidate >= base_ip);
            assert(candidate < ip + i);
            *table_entry = delta + i;
            if (SNAPPY_PREDICT_FALSE(LittleEndian::Load32(candidate) == dword)) {
              *op = LITERAL | (i << 2);
              UnalignedCopy128(next_emit, op + 1);
              ip += i;
              op = op + i + 2;
              goto emit_match;
            }
            data >>= 8;
          }
          data = LittleEndian::Load64(ip + 4 * j + 4);
        }
        ip += 16;
        skip += 16;
      }
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry = TableEntry(table, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 5;
        skip += bytes_between_hash_lookups;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          break;
        }
        data = LittleEndian::Load32(next_ip);
        ip = next_ip;
      }

      // Step 2: A 4-byte match has been found.  We'll later see if more
      // than 4 bytes match.  But, prior to the match, input
      // bytes [next_emit, ip) are unmatched.  Emit them as "literal bytes."
      assert(next_emit + 16 <= ip_end);
      op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit, ip - next_emit);

      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
    emit_match:
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        std::pair<size_t, bool> p =
            FindMatchLength(candidate + 4, ip + 4, ip_end, &data);
        size_t matched = 4 + p.first;
        ip += matched;
        size_t offset = base - candidate;
        assert(0 == memcmp(base, candidate, matched));
        if (p.second) {
          op = EmitCopy</*len_less_than_12=*/true>(op, offset, matched);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset, matched);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // Expect 5 bytes to match
        assert((data & 0xFFFFFFFFFF) ==
               (LittleEndian::Load64(ip) & 0xFFFFFFFFFF));
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that.  To improve compression,
        // we also update table[Hash(ip - 1, mask)] and table[Hash(ip, mask)].
        *TableEntry(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;
        uint16_t* table_entry = TableEntry(table, data, mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        // Measurements on the benchmarks have shown the following probabilities
        // for the loop to exit (ie. avg. number of iterations is reciprocal).
        // BM_Flat/6  txt1    p = 0.3-0.4
        // BM_Flat/7  txt2    p = 0.35
        // BM_Flat/8  txt3    p = 0.3-0.4
        // BM_Flat/9  txt3    p = 0.34-0.4
        // BM_Flat/10 pb      p = 0.4
        // BM_Flat/11 gaviota p = 0.1
        // BM_Flat/12 cp      p = 0.5
        // BM_Flat/13 c       p = 0.3
      } while (static_cast<uint32_t>(data) == LittleEndian::Load32(candidate));
      // Because the least significant 5 bytes matched, we can utilize data
      // for the next iteration.
      preload = data >> 8;
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}